

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O0

int xmlThrDefLoadExtDtdDefaultValue(int v)

{
  int iVar1;
  int ret;
  int v_local;
  
  xmlMutexLock(&xmlThrDefMutex);
  iVar1 = xmlLoadExtDtdDefaultValueThrDef;
  xmlLoadExtDtdDefaultValueThrDef = v;
  xmlMutexUnlock(&xmlThrDefMutex);
  return iVar1;
}

Assistant:

int xmlThrDefLoadExtDtdDefaultValue(int v) {
    int ret;
    xmlMutexLock(&xmlThrDefMutex);
    ret = xmlLoadExtDtdDefaultValueThrDef;
    xmlLoadExtDtdDefaultValueThrDef = v;
    xmlMutexUnlock(&xmlThrDefMutex);
    return ret;
}